

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

bool __thiscall
HPack::HuffmanDecoder::decodeStream
          (HuffmanDecoder *this,BitIStream *inputStream,QByteArray *outputBuffer)

{
  char cVar1;
  pointer pPVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  quint32 qVar6;
  uint uVar7;
  quint64 from;
  int iVar8;
  uint uVar9;
  quint32 qVar10;
  long in_FS_OFFSET;
  bool bVar11;
  PrefixTable table;
  PrefixTable table_00;
  PrefixTableEntry PVar12;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  from = inputStream->offset;
  uVar3 = BitIStream::peekBits<unsigned_int>(inputStream,from,0x20,&local_3c);
  iVar8 = (int)uVar3;
  do {
    if (iVar8 == 0) {
      bVar11 = BitIStream::hasMoreBits(inputStream);
      bVar11 = !bVar11;
LAB_001e285c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar11;
      }
LAB_001e2885:
      __stack_chk_fail();
    }
    uVar9 = (uint)uVar3;
    if (uVar9 < this->minCodeLength) {
LAB_001e281f:
      BitIStream::skipBits(inputStream,uVar3 & 0xffffffff);
      if (uVar9 < 8) {
        bVar11 = (-1 << ((byte)uVar3 & 0x1f) ^ local_3c >> (-(byte)uVar3 & 0x1f)) == 0xffffffff;
      }
      else {
LAB_001e285a:
        bVar11 = false;
      }
      goto LAB_001e285c;
    }
    pPVar2 = (this->prefixTables).
             super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->prefixTables).
        super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
        super__Vector_impl_data._M_finish == pPVar2) {
LAB_001e2880:
      decodeStream();
      goto LAB_001e2885;
    }
    cVar1 = (char)pPVar2->indexLength;
    table._1_7_ = (undefined7)(from >> 8);
    table.prefixLength._0_1_ = cVar1;
    table.offset = pPVar2->offset;
    PVar12 = tableEntry(this,table,local_3c >> (-cVar1 & 0x1fU));
    qVar6 = PVar12.byteValue;
    uVar7 = PVar12.bitLength;
    uVar4 = PVar12._0_8_ >> 0x20;
    if (uVar4 != 0) {
      qVar10 = PVar12.nextTable;
      do {
        pPVar2 = (this->prefixTables).
                 super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->prefixTables).
                       super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 2) *
                -0x5555555555555555;
        if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
          decodeStream();
          goto LAB_001e2880;
        }
        table_00.offset = pPVar2[uVar4].offset;
        table_00._0_8_ = uVar4 * 3;
        PVar12 = tableEntry(this,table_00,
                            (local_3c << ((byte)pPVar2[uVar4].prefixLength & 0x1f)) >>
                            (-(char)pPVar2[uVar4].indexLength & 0x1fU));
        qVar6 = PVar12.byteValue;
        uVar7 = PVar12.bitLength;
        uVar4 = PVar12._0_8_ >> 0x20;
        bVar11 = qVar10 != PVar12.nextTable;
        qVar10 = PVar12.nextTable;
      } while (bVar11);
    }
    if (uVar9 < uVar7) goto LAB_001e281f;
    if ((uVar7 == 0) || (qVar6 == 0x100)) {
      BitIStream::skipBits(inputStream,uVar3 & 0xffffffff);
      goto LAB_001e285a;
    }
    QByteArray::append((char)outputBuffer);
    BitIStream::skipBits(inputStream,(ulong)uVar7);
    local_3c = 0;
    from = inputStream->offset;
    uVar3 = BitIStream::peekBits<unsigned_int>(inputStream,from,0x20,&local_3c);
    iVar8 = (int)uVar3;
  } while( true );
}

Assistant:

bool HuffmanDecoder::decodeStream(BitIStream &inputStream, QByteArray &outputBuffer)
{
    while (true) {
        quint32 chunk = 0;
        const quint32 readBits = inputStream.peekBits(inputStream.streamOffset(), 32, &chunk);
        if (!readBits)
            return !inputStream.hasMoreBits();

        if (readBits < minCodeLength) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        quint32 tableIndex = 0;
        const PrefixTable *table = &prefixTables[tableIndex];
        quint32 entryIndex = chunk >> (32 - table->indexLength);
        PrefixTableEntry entry = tableEntry(*table, entryIndex);

        while (true) {
            if (entry.nextTable == tableIndex)
                break;

            tableIndex = entry.nextTable;
            table = &prefixTables[tableIndex];
            entryIndex = chunk << table->prefixLength >> (32 - table->indexLength);
            entry = tableEntry(*table, entryIndex);
        }

        if (entry.bitLength > readBits) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        if (!entry.bitLength || entry.byteValue == 256) {
            //EOS (256) == compression error (HPACK).
            inputStream.skipBits(readBits);
            return false;
        }

        outputBuffer.append(entry.byteValue);
        inputStream.skipBits(entry.bitLength);
    }

    return false;
}